

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_GMAA_MAAstarCluster.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  QBG *this;
  PlanningUnitMADPDiscreteParameters params;
  ProblemDecTiger pdt;
  PlanningUnitMADPDiscreteParameters local_709 [9];
  double local_700;
  GMAA_MAAstarCluster local_6f8 [824];
  undefined1 local_3c0 [40];
  double local_398;
  QBG *local_2c0;
  ProblemDecTiger local_268;
  
  ProblemDecTiger::ProblemDecTiger(&local_268);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"---------------------------------------",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------gmaa MAA* QBG  -horizon=",0x1e);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"-------",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(local_709);
  PlanningUnitMADPDiscreteParameters::SetComputeAll(SUB81(local_709,0));
  GMAA_MAAstarCluster::GMAA_MAAstarCluster
            (local_6f8,(BGIP_SolverCreatorInterface *)0x0,4,
             (DecPOMDPDiscreteInterface *)
             (&local_268.super_DecPOMDPDiscrete + *(long *)(local_268._0_8_ + -0x50)),local_709,0);
  GeneralizedMAAStarPlanner::SetVerbose((int)local_3c0);
  this = (QBG *)operator_new(0x60);
  QBG::QBG(this,(PlanningUnitDecPOMDPDiscrete *)local_6f8);
  (**(code **)(*(long *)(this + *(long *)(*(long *)this + -0x60)) + 0x10))
            (this + *(long *)(*(long *)this + -0x60));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"heuristic computed.",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  local_2c0 = this;
  GeneralizedMAAStarPlanner::Plan();
  local_700 = local_398;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\noptimal value=",0xf);
  std::ostream::_M_insert<double>(local_700);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  (**(code **)(*(long *)this + 8))(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"nr of BG jpols evaluated=",0x19);
  poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Max nr of jpols in Pool=",0x18);
  poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  TimedAlgorithm::PrintTimersSummary();
  GMAA_MAAstarCluster::~GMAA_MAAstarCluster(local_6f8);
  PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(local_709);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\nTotal ticks ",0xe);
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," clock ticks = ",0xf);
  poVar1 = std::ostream::_M_insert<double>(0.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"s",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Total utime = ",0xe);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," clock ticks = ",0xf);
  poVar1 = std::ostream::_M_insert<double>(0.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"s",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  DecPOMDPDiscrete::~DecPOMDPDiscrete(&local_268.super_DecPOMDPDiscrete);
  return 0;
}

Assistant:

int main()
{    
    ProblemDecTiger pdt;

//    for(size_t h = 4; h <= 4; h++)
    for(size_t h = 4; h <= 4; h++)
    {

        cout << "---------------------------------------"<<endl;
        cout << "------gmaa MAA* QBG  -horizon="<<h<<"-------"<<endl;
        TestGMAA_MAAstar(h, pdt, eQBG);        
        //cout << "---------------------------------------"<<endl;
        //cout << "------gmaa MAA* QPOMDP  -horizon="<<h<<"----"<<endl;
        //TestGMAA_MAAstar(h, pdt, eQPOMDP);
        //cout << "---------------------------------------"<<endl;
        //cout << "------gmaa MAA* QMDP  -horizon="<<h<<"------"<<endl;
        //TestGMAA_MAAstar(h, pdt, eQMDP);
    }
    
    cout << "\n\nTotal ticks "<< tot_ticks << " clock ticks = " << 
        (double)(tot_ticks) / cps <<"s" << endl <<
        "Total utime = "<< tot_utime << " clock ticks = "<< 
        (double (tot_utime))/ cps << "s" << endl;
}